

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O0

string * vkt::image::anon_unknown_0::getCoordStr
                   (string *__return_storage_ptr__,ImageType imageType,string *x,string *y,string *z
                   )

{
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *z_local;
  string *y_local;
  string *x_local;
  string *psStack_10;
  ImageType imageType_local;
  
  local_30 = z;
  z_local = y;
  y_local = x;
  x_local._4_4_ = imageType;
  psStack_10 = __return_storage_ptr__;
  if (imageType != IMAGE_TYPE_1D) {
    if (imageType - IMAGE_TYPE_1D_ARRAY < 2) {
      std::operator+(&local_90,"ivec2(",x);
      std::operator+(&local_70,&local_90,",");
      std::operator+(&local_50,&local_70,z_local);
      std::operator+(__return_storage_ptr__,&local_50,")");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      return __return_storage_ptr__;
    }
    if (imageType - IMAGE_TYPE_2D_ARRAY < 4) {
      std::operator+(&local_140,"ivec3(",x);
      std::operator+(&local_120,&local_140,",");
      std::operator+(&local_100,&local_120,z_local);
      std::operator+(&local_e0,&local_100,",");
      std::operator+(&local_c0,&local_e0,local_30);
      std::operator+(__return_storage_ptr__,&local_c0,")");
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      return __return_storage_ptr__;
    }
    if (imageType != IMAGE_TYPE_BUFFER) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_141);
      std::allocator<char>::~allocator(&local_141);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)x);
  return __return_storage_ptr__;
}

Assistant:

static string getCoordStr (const ImageType		imageType,
						   const std::string&	x,
						   const std::string&	y,
						   const std::string&	z)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
			return x;
		case IMAGE_TYPE_1D_ARRAY:
		case IMAGE_TYPE_2D:
			return string("ivec2(" + x + "," + y + ")");
		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_3D:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			return string("ivec3(" + x + "," + y + "," + z + ")");
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}